

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O1

void R_DrawSkyPlane(visplane_t *pl)

{
  ushort uVar1;
  uint uVar2;
  int x2;
  side_t *psVar3;
  unsigned_short *puVar4;
  double dVar5;
  double __y;
  lighttable_t *plVar6;
  FTexture *pFVar7;
  float fVar8;
  line_t *plVar9;
  FTextureID FVar10;
  FTextureID FVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  short sVar18;
  unsigned_short uVar19;
  code *pcVar20;
  ushort uVar21;
  ulong uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  double dVar25;
  double dVar26;
  short bot [5760];
  short top [5760];
  double local_5a68;
  unsigned_short local_5a38 [5760];
  short local_2d38 [5764];
  
  plVar9 = lines;
  uVar22 = (ulong)sky2texture.texnum;
  FVar10.texnum = sky2texture.texnum;
  if ((level.flags & 0x10000004) != 0x10000000) {
    FVar10.texnum = sky1texture.texnum;
  }
  skymid = skytexturemid;
  skyangle = SUB84(ViewAngle.Degrees * 11930464.711111112 + 6755399441055744.0,0);
  if ((pl->picnum).texnum != skyflatnum.texnum) {
    uVar23 = 0;
    uVar24 = 0;
    local_5a68 = 0.0;
    goto LAB_0030a527;
  }
  uVar2 = pl->sky;
  if ((uVar2 >> 0x1e & 1) != 0) {
    if (uVar2 == 0x40000000) {
      if (uVar22 < TexMan.Textures.Count) {
        FVar10 = FTextureManager::PalCheck(&TexMan,TexMan.Translation.Array[uVar22]);
        frontskytex = TexMan.Textures.Array[FVar10.texnum].Texture;
      }
      else {
        frontskytex = (FTexture *)0x0;
      }
      local_5a68 = 0.0;
      backskytex = (FTexture *)0x0;
      frontcyl = sky2cyl;
      skyflip = 0;
      uVar23 = SUB84(sky2pos,0);
      uVar24 = (undefined4)((ulong)sky2pos >> 0x20);
      goto LAB_0030a527;
    }
    psVar3 = lines[((long)(int)uVar2 & 0x1fffffffbfffffffU) - 1].sidedef[0];
    if (((level.flags >> 0x1c & 1) == 0) || (iVar15 = 2, psVar3->textures[2].texture.texnum < 1)) {
      iVar15 = 0;
    }
    uVar13 = (ulong)*(int *)((long)&psVar3->textures[0].texture.texnum +
                            (ulong)(uint)(iVar15 * 0x30));
    if (uVar13 < TexMan.Textures.Count) {
      FVar11 = FTextureManager::PalCheck(&TexMan,TexMan.Translation.Array[uVar13]);
      frontskytex = TexMan.Textures.Array[FVar11.texnum].Texture;
    }
    else {
      frontskytex = (FTexture *)0x0;
    }
    if ((frontskytex != (FTexture *)0x0) && (frontskytex->UseType != '\r')) {
      local_5a68 = 0.0;
      backskytex = (FTexture *)0x0;
      skyangle = skyangle +
                 SUB84(*(double *)
                        ((long)&psVar3->textures[0].xOffset + (ulong)(uint)(iVar15 * 0x30)) +
                       103079215104.0,0);
      skymid = *(double *)((long)&psVar3->textures[0].yOffset + (ulong)(uint)(iVar15 * 0x30)) +
               -28.0;
      skyflip = -(uint)(plVar9[((long)(int)uVar2 & 0x1fffffffbfffffffU) - 1].args[2] == 0);
      frontcyl = (fixed_t)((frontskytex->Scale).X * 1024.0);
      if (frontcyl < (int)(uint)frontskytex->Width) {
        frontcyl = (uint)frontskytex->Width;
      }
      if (skystretch == true) {
        skymid = (skymid * 0.0043859649122807015 * (double)frontskytex->Height) /
                 (frontskytex->Scale).Y;
      }
      uVar23 = 0;
      uVar24 = 0;
      goto LAB_0030a527;
    }
  }
  if ((ulong)(long)FVar10.texnum < (ulong)TexMan.Textures.Count) {
    FVar10 = FTextureManager::PalCheck(&TexMan,TexMan.Translation.Array[FVar10.texnum]);
    frontskytex = TexMan.Textures.Array[FVar10.texnum].Texture;
  }
  else {
    frontskytex = (FTexture *)0x0;
  }
  if (((level.flags & 4) == 0) || (TexMan.Textures.Count <= uVar22)) {
    backskytex = (FTexture *)0x0;
  }
  else {
    FVar10 = FTextureManager::PalCheck(&TexMan,TexMan.Translation.Array[uVar22]);
    backskytex = TexMan.Textures.Array[FVar10.texnum].Texture;
  }
  skyflip = 0;
  uVar23 = SUB84(sky1pos,0);
  uVar24 = (undefined4)((ulong)sky1pos >> 0x20);
  local_5a68 = sky2pos;
  frontcyl = sky1cyl;
  backcyl = sky2cyl;
LAB_0030a527:
  dVar26 = fmod((double)CONCAT44(uVar24,uVar23),(double)sky1cyl * 65536.0);
  pFVar7 = backskytex;
  frontpos = (int)dVar26;
  if (backskytex != (FTexture *)0x0) {
    dVar26 = fmod(local_5a68,(double)sky2cyl * 65536.0);
    backpos = (int)dVar26;
  }
  fVar8 = skyiscale;
  plVar6 = fixedcolormap;
  if (fixedcolormap == (lighttable_t *)0x0) {
    fixedcolormap = NormalLight.Maps;
  }
  iVar15 = pl->left;
  lVar14 = (long)iVar15;
  iVar12 = pl->right;
  lVar17 = lVar14;
  dc_colormap = fixedcolormap;
  if (iVar15 < iVar12) {
    do {
      swall[lVar17] = fVar8;
      lVar17 = lVar17 + 1;
    } while (iVar12 != lVar17);
    if (((byte)MirrorFlags & 1) == 0) {
      iVar15 = iVar15 << 0x10;
      do {
        lwall[lVar14] = iVar15;
        lVar14 = lVar14 + 1;
        iVar15 = iVar15 + 0x10000;
      } while (lVar14 < pl->right);
    }
    else {
      iVar15 = viewwidth * 0x10000 + iVar15 * -0x10000;
      do {
        lwall[lVar14] = iVar15;
        lVar14 = lVar14 + 1;
        iVar15 = iVar15 + -0x10000;
      } while (lVar14 < pl->right);
    }
    lastskycol[0] = 0xffffffff;
    lastskycol[1] = 0xffffffff;
    lastskycol[2] = 0xffffffff;
    lastskycol[3] = 0xffffffff;
    rw_pic = frontskytex;
    rw_offset = 0;
    dVar26 = (frontskytex->Scale).Y;
    dc_texturemid = skymid * dVar26;
    uVar1 = frontskytex->Height;
    if (1 << (frontskytex->HeightBits & 0x1f) == (uint)uVar1) {
      lastskycol[0] = 0xffffffff;
      lastskycol[1] = 0xffffffff;
      lastskycol[2] = 0xffffffff;
      lastskycol[3] = 0xffffffff;
      pcVar20 = R_GetTwoSkyColumns;
      if (pFVar7 == (FTexture *)0x0) {
        pcVar20 = R_GetOneSkyColumn;
      }
      wallscan(pl->left,pl->right,(short *)&pl->field_0xda,(short *)pl->bottom,swall,lwall,dVar26,
               pcVar20);
    }
    else {
      dVar26 = dVar26 * skyscale;
      dVar25 = (1.0 - CenterY) * (1.0 / dVar26);
      __y = (double)frontskytex->Height;
      dVar5 = fmod(skymid + dVar25,__y);
      dVar5 = (double)(-(ulong)(dVar5 < 0.0) & (ulong)__y) + dVar5;
      dc_texturemid = dVar5 - dVar25;
      if (0 < viewheight) {
        iVar15 = (int)((__y - dVar5) * dVar26);
        iVar12 = 0;
        do {
          iVar16 = iVar15;
          iVar15 = pl->left;
          lVar17 = (long)iVar15;
          x2 = pl->right;
          uVar21 = (ushort)iVar16;
          if (iVar15 < x2) {
            puVar4 = pl->bottom;
            do {
              sVar18 = *(short *)(&pl->field_0xda + lVar17 * 2);
              if (*(short *)(&pl->field_0xda + lVar17 * 2) < (short)iVar12) {
                sVar18 = (short)iVar12;
              }
              local_2d38[lVar17] = sVar18;
              uVar19 = puVar4[lVar17];
              if ((short)uVar21 < (short)puVar4[lVar17]) {
                uVar19 = uVar21;
              }
              local_5a38[lVar17] = uVar19;
              lVar17 = lVar17 + 1;
            } while (x2 != lVar17);
          }
          lastskycol[0] = 0xffffffff;
          lastskycol[1] = 0xffffffff;
          lastskycol[2] = 0xffffffff;
          lastskycol[3] = 0xffffffff;
          pcVar20 = R_GetTwoSkyColumns;
          if (backskytex == (FTexture *)0x0) {
            pcVar20 = R_GetOneSkyColumn;
          }
          wallscan(iVar15,x2,local_2d38,(short *)local_5a38,swall,lwall,(rw_pic->Scale).Y,pcVar20);
          dc_texturemid = (double)((short)~uVar21 + centery) * (1.0 / dVar26);
          iVar15 = iVar16 + (int)((double)uVar1 * dVar26);
          iVar12 = iVar16;
        } while ((short)uVar21 < viewheight);
      }
    }
  }
  if (plVar6 == (lighttable_t *)0x0) {
    fixedcolormap = (lighttable_t *)0x0;
  }
  return;
}

Assistant:

void R_DrawSkyPlane (visplane_t *pl)
{
	FTextureID sky1tex, sky2tex;
	double frontdpos = 0, backdpos = 0;

	if ((level.flags & LEVEL_SWAPSKIES) && !(level.flags & LEVEL_DOUBLESKY))
	{
		sky1tex = sky2texture;
	}
	else
	{
		sky1tex = sky1texture;
	}
	sky2tex = sky2texture;
	skymid = skytexturemid;
	skyangle = ViewAngle.BAMs();

	if (pl->picnum == skyflatnum)
	{
		if (!(pl->sky & PL_SKYFLAT))
		{	// use sky1
		sky1:
			frontskytex = TexMan(sky1tex, true);
			if (level.flags & LEVEL_DOUBLESKY)
				backskytex = TexMan(sky2tex, true);
			else
				backskytex = NULL;
			skyflip = 0;
			frontdpos = sky1pos;
			backdpos = sky2pos;
			frontcyl = sky1cyl;
			backcyl = sky2cyl;
		}
		else if (pl->sky == PL_SKYFLAT)
		{	// use sky2
			frontskytex = TexMan(sky2tex, true);
			backskytex = NULL;
			frontcyl = sky2cyl;
			skyflip = 0;
			frontdpos = sky2pos;
		}
		else
		{	// MBF's linedef-controlled skies
			// Sky Linedef
			const line_t *l = &lines[(pl->sky & ~PL_SKYFLAT)-1];

			// Sky transferred from first sidedef
			const side_t *s = l->sidedef[0];
			int pos;

			// Texture comes from upper texture of reference sidedef
			// [RH] If swapping skies, then use the lower sidedef
			if (level.flags & LEVEL_SWAPSKIES && s->GetTexture(side_t::bottom).isValid())
			{
				pos = side_t::bottom;
			}
			else
			{
				pos = side_t::top;
			}

			frontskytex = TexMan(s->GetTexture(pos), true);
			if (frontskytex == NULL || frontskytex->UseType == FTexture::TEX_Null)
			{ // [RH] The blank texture: Use normal sky instead.
				goto sky1;
			}
			backskytex = NULL;

			// Horizontal offset is turned into an angle offset,
			// to allow sky rotation as well as careful positioning.
			// However, the offset is scaled very small, so that it
			// allows a long-period of sky rotation.
			skyangle += FLOAT2FIXED(s->GetTextureXOffset(pos));

			// Vertical offset allows careful sky positioning.
			skymid = s->GetTextureYOffset(pos) - 28;

			// We sometimes flip the picture horizontally.
			//
			// Doom always flipped the picture, so we make it optional,
			// to make it easier to use the new feature, while to still
			// allow old sky textures to be used.
			skyflip = l->args[2] ? 0u : ~0u;

			int frontxscale = int(frontskytex->Scale.X * 1024);
			frontcyl = MAX(frontskytex->GetWidth(), frontxscale);
			if (skystretch)
			{
				skymid = skymid * frontskytex->GetScaledHeightDouble() / SKYSTRETCH_HEIGHT;
			}
		}
	}
	frontpos = int(fmod(frontdpos, sky1cyl * 65536.0));
	if (backskytex != NULL)
	{
		backpos = int(fmod(backdpos, sky2cyl * 65536.0));
	}

	bool fakefixed = false;
	if (fixedcolormap)
	{
		dc_colormap = fixedcolormap;
	}
	else
	{
		fakefixed = true;
		fixedcolormap = dc_colormap = NormalLight.Maps;
	}

	R_DrawSky (pl);

	if (fakefixed)
		fixedcolormap = NULL;
}